

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateCodingSynapse.cpp
# Opt level: O2

void __thiscall
RateCodingSynapse::initialize(RateCodingSynapse *this,Population *n_from,Population *n_to)

{
  int iVar1;
  int iVar2;
  Clock *pCVar3;
  Logging *pLVar4;
  ValueEvent *this_00;
  ostream *poVar5;
  undefined8 *puVar6;
  allocator_type local_81;
  _Deque_base<double,_std::allocator<double>_> local_80;
  
  iVar2 = (*n_from->_vptr_Population[3])(n_from);
  this->inputSize = iVar2;
  iVar2 = (*n_to->_vptr_Population[2])(n_to);
  this->outputSize = iVar2;
  if (iVar2 == 1) {
    this->singleOutput = true;
  }
  else if (this->inputSize != iVar2) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "Number of input neurons not equal to number of output neurons");
    std::endl<char,std::char_traits<char>>(poVar5);
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = "Number of input neurons not equal to number of output neurons";
    __cxa_throw(puVar6,&char_const*::typeinfo,0);
  }
  (this->super_Synapse).from_population = n_from;
  (this->super_Synapse).to_population = n_to;
  pCVar3 = Clock::getInstance();
  this->clock = pCVar3;
  pLVar4 = Logging::getInstance();
  this->logger = pLVar4;
  for (iVar2 = 0; iVar2 < this->inputSize; iVar2 = iVar2 + 1) {
    this_00 = (ValueEvent *)operator_new(0x20);
    ValueEvent::ValueEvent(this_00);
    local_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)this_00;
    std::vector<Event*,std::allocator<Event*>>::emplace_back<Event*>
              ((vector<Event*,std::allocator<Event*>> *)&this->output,(Event **)&local_80);
    iVar1 = this->inputSize;
    std::deque<double,_std::allocator<double>_>::deque
              ((deque<double,_std::allocator<double>_> *)&local_80,0,&local_81);
    std::
    vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
    ::_M_fill_assign(&this->spikes,(long)iVar1,(value_type *)&local_80);
    std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_80);
  }
  return;
}

Assistant:

void RateCodingSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfOutputNeurons();
    outputSize = n_to->getNumberOfInputNeurons();
    if(outputSize == 1) {
        singleOutput = true;
    }
    else if(inputSize != outputSize) {
        cout << "Number of input neurons not equal to number of output neurons" << endl;
        throw "Number of input neurons not equal to number of output neurons";
    }
    from_population = n_from;
    to_population = n_to;
    clock = Clock::getInstance();
    logger = Logging::getInstance();
    for(int i = 0; i < inputSize; i++) {
        output.push_back(new ValueEvent());
        spikes.assign(inputSize, deque<double>(0));
    }
}